

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall gvr::Model::translate(Model *this,Vector3d *v)

{
  int i;
  long lVar1;
  SVector<double,_3> ret;
  
  lVar1 = 0;
  do {
    (this->origin).v[lVar1] = v->v[lVar1] + (this->origin).v[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  ret.v[0] = 0.0;
  ret.v[1] = 0.0;
  ret.v[2] = 0.0;
  lVar1 = 0;
  do {
    ret.v[lVar1] = (this->Tc).v[lVar1] + v->v[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->Tc).v[2] = ret.v[2];
  (this->Tc).v[0] = ret.v[0];
  (this->Tc).v[1] = ret.v[1];
  return;
}

Assistant:

virtual void translate(const gmath::Vector3d &v)
    {
      origin+=v;
      setDefCameraRT(getDefCameraR(), getDefCameraT()+v);
    }